

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtptcptransmitter.cpp
# Opt level: O1

RTPTransmissionInfo * __thiscall
jrtplib::RTPTCPTransmitter::GetTransmissionInfo(RTPTCPTransmitter *this)

{
  RTPMemoryManager *pRVar1;
  int iVar2;
  undefined4 extraout_var;
  RTPTransmissionInfo *pRVar3;
  
  if (this->m_init == true) {
    pRVar1 = (this->super_RTPTransmitter).super_RTPMemoryObject.mgr;
    if (pRVar1 == (RTPMemoryManager *)0x0) {
      pRVar3 = (RTPTransmissionInfo *)operator_new(0x10);
    }
    else {
      iVar2 = (*pRVar1->_vptr_RTPMemoryManager[2])(pRVar1,0x10,0x1c);
      pRVar3 = (RTPTransmissionInfo *)CONCAT44(extraout_var,iVar2);
    }
    pRVar3->protocol = TCPProto;
    pRVar3->_vptr_RTPTransmissionInfo = (_func_int **)&PTR__RTPTransmissionInfo_0013f788;
    return pRVar3;
  }
  return (RTPTransmissionInfo *)0x0;
}

Assistant:

RTPTransmissionInfo *RTPTCPTransmitter::GetTransmissionInfo()
{
	if (!m_init)
		return 0;

	MAINMUTEX_LOCK
	RTPTransmissionInfo *tinf = RTPNew(GetMemoryManager(),RTPMEM_TYPE_CLASS_RTPTRANSMISSIONINFO) RTPTCPTransmissionInfo();
	MAINMUTEX_UNLOCK
	return tinf;
}